

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O1

void __thiscall Environment::Define(Environment *this,size_t symbol)

{
  pointer puVar1;
  unsigned_long uVar2;
  mapped_type *pmVar3;
  size_t local_18;
  size_t symbol_local;
  
  puVar1 = (this->slot_map).
           super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = puVar1[-1]._M_h._M_element_count;
  local_18 = symbol;
  pmVar3 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(puVar1 + -1),&local_18);
  (pmVar3->super__Tuple_impl<0UL,_bool,_unsigned_long>).super__Head_base<0UL,_bool,_false>.
  _M_head_impl = false;
  (pmVar3->super__Tuple_impl<0UL,_bool,_unsigned_long>).super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = uVar2;
  return;
}

Assistant:

void Environment::Define(size_t symbol) {
  std::unordered_map<size_t, std::tuple<bool, size_t>> &env = slot_map.back();
  size_t idx = env.size();
  env[symbol] = std::make_tuple(false, idx);
}